

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> * __thiscall
kj::ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::operator=
          (ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *this,
          ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *other)

{
  RemoveConst<capnp::schema::Node::SourceInfo::Reader> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (Reader *)0x0;
  other->pos = (RemoveConst<capnp::schema::Node::SourceInfo::Reader> *)0x0;
  other->endPtr = (Reader *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }